

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

bool sciplot::gnuplot::runscript(string *scriptfilename,bool persistent)

{
  int iVar1;
  char *__s;
  undefined7 in_register_00000031;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  char *local_48 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  __s = "gnuplot ";
  if ((int)CONCAT71(in_register_00000031,persistent) != 0) {
    __s = "gnuplot -persistent ";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,__s,(allocator<char> *)&bStack_68);
  std::operator+(&local_28,"\"",scriptfilename);
  std::operator+(&bStack_68,&local_28,"\"");
  std::__cxx11::string::append((string *)local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  iVar1 = system(local_48[0]);
  std::__cxx11::string::~string((string *)local_48);
  return iVar1 == 0;
}

Assistant:

inline auto runscript(std::string scriptfilename, bool persistent) -> bool
{
    std::string command = persistent ? "gnuplot -persistent " : "gnuplot ";
    command += "\"" + scriptfilename + "\"";
    return std::system(command.c_str()) == 0;
}